

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O2

void __thiscall obx::Transaction::success(Transaction *this)

{
  obx_err err;
  
  if (this->cTxn_ != (OBX_txn *)0x0) {
    this->cTxn_ = (OBX_txn *)0x0;
    err = obx_txn_success();
    internal::checkErrOrThrow(err);
    return;
  }
  internal::throwIllegalStateException("State condition failed: ","txn");
}

Assistant:

void Transaction::success() {
    OBX_txn* txn = cTxn_;
    OBX_VERIFY_STATE(txn);
    cTxn_ = nullptr;
    internal::checkErrOrThrow(obx_txn_success(txn));
}